

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O1

char * SimpleString::copyToNewBuffer(char *bufferToCopy,size_t bufferSize)

{
  char cVar1;
  int iVar2;
  char *result;
  TestMemoryAllocator *pTVar3;
  undefined4 extraout_var;
  long lVar5;
  bool bVar6;
  char *pcVar4;
  
  pTVar3 = stringAllocator_;
  if (stringAllocator_ == (TestMemoryAllocator *)0x0) {
    pTVar3 = defaultNewArrayAllocator();
  }
  iVar2 = (*pTVar3->_vptr_TestMemoryAllocator[2])
                    (pTVar3,bufferSize,
                     "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/build_O1/CMake/cpputest/cpputest-src/src/CppUTest/SimpleString.cpp"
                     ,0x22d);
  pcVar4 = (char *)CONCAT44(extraout_var,iVar2);
  if ((bufferSize != 0) && (pcVar4 != (char *)0x0)) {
    lVar5 = 0;
    do {
      cVar1 = bufferToCopy[lVar5];
      pcVar4[lVar5] = cVar1;
      if (cVar1 == '\0') break;
      bVar6 = bufferSize - 1 != lVar5;
      lVar5 = lVar5 + 1;
    } while (bVar6);
  }
  pcVar4[bufferSize - 1] = '\0';
  return pcVar4;
}

Assistant:

char* SimpleString::copyToNewBuffer(const char* bufferToCopy, size_t bufferSize)
{
    char* newBuffer = allocStringBuffer(bufferSize, __FILE__, __LINE__);
    StrNCpy(newBuffer, bufferToCopy, bufferSize);
    newBuffer[bufferSize-1] = '\0';
    return newBuffer;
}